

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOStreamBuffer.h
# Opt level: O2

bool __thiscall Assimp::IOStreamBuffer<char>::readNextBlock(IOStreamBuffer<char> *this)

{
  int iVar1;
  undefined4 extraout_var;
  ulong uVar3;
  ulong uVar2;
  
  (*this->m_stream->_vptr_IOStream[4])(this->m_stream,this->m_filePos,0);
  iVar1 = (*this->m_stream->_vptr_IOStream[2])
                    (this->m_stream,
                     (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,1,this->m_cacheSize);
  uVar2 = CONCAT44(extraout_var,iVar1);
  if (uVar2 != 0) {
    uVar3 = this->m_cacheSize;
    if (uVar2 < this->m_cacheSize) {
      this->m_cacheSize = uVar2;
      uVar3 = uVar2;
    }
    this->m_filePos = this->m_filePos + uVar3;
    this->m_cachePos = 0;
    this->m_blockIdx = this->m_blockIdx + 1;
  }
  return uVar2 != 0;
}

Assistant:

AI_FORCE_INLINE
bool IOStreamBuffer<T>::readNextBlock() {
    m_stream->Seek( m_filePos, aiOrigin_SET );
    size_t readLen = m_stream->Read( &m_cache[ 0 ], sizeof( T ), m_cacheSize );
    if ( readLen == 0 ) {
        return false;
    }
    if ( readLen < m_cacheSize ) {
        m_cacheSize = readLen;
    }
    m_filePos += m_cacheSize;
    m_cachePos = 0;
    m_blockIdx++;

    return true;
}